

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

int Bac_ManExtract_rec(Gia_Man_t *pNew,Bac_Ntk_t *p,int i,int fBuffers,Vec_Int_t *vMap)

{
  void **ppvVar1;
  Dec_Graph_t *pFForm;
  Bac_Man_t *pBVar2;
  int iVar3;
  Bac_ObjType_t BVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Bac_Ntk_t *p_00;
  int iVar10;
  ulong uVar11;
  int pLits [16];
  Vec_Int_t Leaves;
  
  iVar3 = Vec_IntEntry(&p->vCopy,i);
  if (-1 < iVar3) {
    return iVar3;
  }
  iVar3 = Bac_ObjIsCo(p,i);
  if (iVar3 != 0) {
    iVar3 = Bac_ObjFanin(p,i);
    iVar3 = Bac_ManExtract_rec(pNew,p,iVar3,fBuffers,vMap);
    goto LAB_006e4a1f;
  }
  BVar4 = Bac_ObjType(p,i);
  if (BVar4 == BAC_OBJ_PI) {
    p_00 = Bac_NtkHostNtk(p);
    iVar3 = p->iBoxObj;
    iVar5 = Bac_ObjIndex(p,i);
    iVar5 = Bac_BoxBi(p_00,iVar3,iVar5);
  }
  else {
    iVar3 = Bac_ObjIsBo(p,i);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                    ,0xd4,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
    iVar3 = Bac_BoxBoBox(p,i);
    iVar5 = Bac_ObjIsBoxUser(p,iVar3);
    if (iVar5 == 0) {
      iVar5 = Bac_ObjIsBox(p,iVar3);
      if ((iVar5 == 0) || (iVar5 = Bac_ObjIsBoxUser(p,iVar3), iVar5 != 0)) {
        __assert_fail("Bac_ObjIsBoxPrim(p, iBox)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,0x8a,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
      uVar11 = 0;
      iVar5 = iVar3;
      while( true ) {
        iVar5 = iVar5 + -1;
        iVar7 = (int)uVar11;
        if ((iVar5 < 0) || (iVar8 = Bac_ObjIsBi(p,iVar5), iVar8 == 0)) break;
        iVar7 = Bac_BoxBi(p,iVar3,iVar7);
        iVar7 = Bac_ObjFanin(p,iVar7);
        iVar7 = Bac_ManExtract_rec(pNew,p,iVar7,fBuffers,vMap);
        pLits[uVar11] = iVar7;
        uVar11 = uVar11 + 1;
      }
      if (0x10 < uVar11) {
        __assert_fail("nLits <= 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,0x8d,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
      ppvVar1 = p->pDesign->ppGraphs;
      if (ppvVar1 != (void **)0x0) {
        iVar3 = Bac_BoxNtkId(p,iVar3);
        pFForm = (Dec_Graph_t *)ppvVar1[iVar3];
        Leaves.pArray = pLits;
        Leaves.nCap = iVar7;
        Leaves.nSize = iVar7;
        if (pFForm != (Dec_Graph_t *)0x0) {
          iVar3 = Gia_ManFactorGraph(pNew,pFForm,&Leaves);
          return iVar3;
        }
        __assert_fail("pGraph != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,0x93,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
      BVar4 = Bac_ObjType(p,iVar3);
      switch(uVar11 & 0xffffffff) {
      case 0:
        iVar3 = 0;
        if (BVar4 != BAC_BOX_CF) {
          if (BVar4 != BAC_BOX_CT) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                          ,0x9f,
                          "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
            ;
          }
          iVar3 = 1;
        }
        goto LAB_006e4a1f;
      case 1:
        if (BVar4 != BAC_BOX_INV) {
          iVar3 = pLits[0];
          if (BVar4 != BAC_BOX_BUF) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                          ,0xa7,
                          "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
            ;
          }
          goto LAB_006e4a1f;
        }
        goto LAB_006e4c65;
      case 2:
        goto code_r0x006e4a90;
      case 3:
        if (BVar4 != BAC_BOX_ADD) {
          if (BVar4 == BAC_BOX_MAJ) {
            iVar3 = Gia_ManHashMaj(pNew,pLits[0],pLits[1],pLits[2]);
          }
          else {
            if (BVar4 != BAC_BOX_MUX) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                            ,0xce,
                            "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                           );
            }
            iVar3 = Gia_ManHashMux(pNew,pLits[0],pLits[1],pLits[2]);
          }
          goto LAB_006e4a1f;
        }
        iVar5 = Gia_ManHashAnd(pNew,pLits[1],pLits[2]);
        iVar7 = Gia_ManHashOr(pNew,pLits[1],pLits[2]);
        iVar8 = Bac_ObjIsBox(p,iVar3);
        if (iVar8 == 0) {
          __assert_fail("Bac_ObjIsBox(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
        }
        iVar8 = 1;
        do {
          iVar10 = iVar8;
          if ((p->vType).nSize <= iVar10 + iVar3) break;
          iVar9 = Bac_ObjIsBo(p,iVar10 + iVar3);
          iVar8 = iVar10 + 1;
        } while (iVar9 != 0);
        if (iVar10 != 3) {
          __assert_fail("Bac_BoxBoNum(p, iBox) == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                        ,199,
                        "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
        }
        iVar8 = Bac_BoxBo(p,iVar3,0);
        if (iVar8 == i) {
          iVar3 = Abc_LitNot(iVar5);
          pLits[1] = Gia_ManHashAnd(pNew,iVar3,iVar7);
          goto LAB_006e4bfc;
        }
        iVar3 = Bac_BoxBo(p,iVar3,1);
        if (iVar3 != i) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                        ,0xcc,
                        "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
        }
        pLits[1] = Gia_ManHashAnd(pNew,pLits[0],iVar7);
        pLits[0] = iVar5;
LAB_006e4c11:
        iVar3 = Gia_ManHashOr(pNew,pLits[0],pLits[1]);
        goto LAB_006e4a1f;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,0xd0,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
    }
    pBVar2 = p->pDesign;
    iVar3 = Bac_ObjIsBo(p,i);
    if (iVar3 == 0) {
      __assert_fail("Bac_ObjIsBo(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x140,"int Bac_BoxBoNtkId(Bac_Ntk_t *, int)");
    }
    iVar3 = Bac_BoxBoBox(p,i);
    uVar6 = Bac_BoxNtkId(p,iVar3);
    if (((int)uVar6 < 1) || (pBVar2->nNtks < (int)uVar6)) {
      p_00 = (Bac_Ntk_t *)0x0;
    }
    else {
      p_00 = pBVar2->pNtks + uVar6;
    }
    iVar3 = Bac_ObjIndex(p,i);
    iVar5 = Vec_IntEntry(&p_00->vOutputs,iVar3);
  }
  iVar3 = Bac_ManExtract_rec(pNew,p_00,iVar5,fBuffers,vMap);
  if (fBuffers != 0) {
    pBVar2 = p->pDesign;
    iVar7 = Bac_NtkId(p);
    iVar8 = Bac_NtkId(p_00);
    iVar3 = Bac_ManAddBarbuf(pNew,iVar3,pBVar2,iVar7,i,iVar8,iVar5,vMap);
  }
  goto LAB_006e4a1f;
code_r0x006e4a90:
  switch(BVar4) {
  case BAC_BOX_AND:
    goto LAB_006e4c85;
  case BAC_BOX_NAND:
    pLits[0] = Gia_ManHashAnd(pNew,pLits[0],pLits[1]);
    break;
  case BAC_BOX_OR:
    goto LAB_006e4c11;
  case BAC_BOX_NOR:
    pLits[0] = Gia_ManHashOr(pNew,pLits[0],pLits[1]);
    break;
  case BAC_BOX_XOR:
LAB_006e4bfc:
    iVar3 = Gia_ManHashXor(pNew,pLits[0],pLits[1]);
    goto LAB_006e4a1f;
  case BAC_BOX_XNOR:
    pLits[0] = Gia_ManHashXor(pNew,pLits[0],pLits[1]);
    break;
  case BAC_BOX_SHARP:
    pLits[1] = Abc_LitNot(pLits[1]);
    goto LAB_006e4c85;
  case BAC_BOX_SHARPL:
    pLits[0] = Abc_LitNot(pLits[0]);
LAB_006e4c85:
    iVar3 = Gia_ManHashAnd(pNew,pLits[0],pLits[1]);
    goto LAB_006e4a1f;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0xbb,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
  }
LAB_006e4c65:
  iVar3 = Abc_LitNot(pLits[0]);
LAB_006e4a1f:
  Bac_ObjSetCopy(p,i,iVar3);
  return iVar3;
}

Assistant:

int Bac_ManExtract_rec( Gia_Man_t * pNew, Bac_Ntk_t * p, int i, int fBuffers, Vec_Int_t * vMap )
{
    int iRes = Bac_ObjCopy( p, i );
    if ( iRes >= 0 )
        return iRes;
    if ( Bac_ObjIsCo(p, i) )
        iRes = Bac_ManExtract_rec( pNew, p, Bac_ObjFanin(p, i), fBuffers, vMap );
    else if ( Bac_ObjIsPi(p, i) )
    {
        Bac_Ntk_t * pHost = Bac_NtkHostNtk( p );
        int iObj = Bac_BoxBi( pHost, Bac_NtkHostObj(p), Bac_ObjIndex(p, i) );
        iRes = Bac_ManExtract_rec( pNew, pHost, iObj, fBuffers, vMap );
        if ( fBuffers )
            iRes = Bac_ManAddBarbuf( pNew, iRes, p->pDesign, Bac_NtkId(p), i, Bac_NtkId(pHost), iObj, vMap );
    }
    else if ( Bac_ObjIsBo(p, i) )
    {
        int iBox = Bac_BoxBoBox(p, i);
        if ( Bac_ObjIsBoxUser(p, iBox) ) // user box
        {
            Bac_Ntk_t * pBox = Bac_BoxBoNtk( p, i );
            int iObj = Bac_NtkPo( pBox, Bac_ObjIndex(p, i) );
            iRes = Bac_ManExtract_rec( pNew, pBox, iObj, fBuffers, vMap );
            if ( fBuffers )
                iRes = Bac_ManAddBarbuf( pNew, iRes, p->pDesign, Bac_NtkId(p), i, Bac_NtkId(pBox), iObj, vMap );
        }
        else // primitive
        {
            int iFanin, nLits, pLits[16];
            assert( Bac_ObjIsBoxPrim(p, iBox) );
            Bac_BoxForEachFanin( p, iBox, iFanin, nLits )
                pLits[nLits] = Bac_ManExtract_rec( pNew, p, iFanin, fBuffers, vMap );
            assert( nLits <= 16 );
            if ( p->pDesign->ppGraphs ) // mapped gate
            {
                extern int Gia_ManFactorGraph( Gia_Man_t * p, Dec_Graph_t * pFForm, Vec_Int_t * vLeaves );
                Dec_Graph_t * pGraph = (Dec_Graph_t *)p->pDesign->ppGraphs[Bac_BoxNtkId(p, iBox)];
                Vec_Int_t Leaves = { nLits, nLits, pLits };
                assert( pGraph != NULL );
                return Gia_ManFactorGraph( pNew, pGraph, &Leaves );
            }
            else
            {
                Bac_ObjType_t Type = Bac_ObjType(p, iBox);
                if ( nLits == 0 )
                {
                    if ( Type == BAC_BOX_CF )
                        iRes = 0;
                    else if ( Type == BAC_BOX_CT )
                        iRes = 1;
                    else assert( 0 );
                }
                else if ( nLits == 1 )
                {
                    if ( Type == BAC_BOX_BUF )
                        iRes = pLits[0];
                    else if ( Type == BAC_BOX_INV )
                        iRes = Abc_LitNot( pLits[0] );
                    else assert( 0 );
                }
                else if ( nLits == 2 )
                {
                    if ( Type == BAC_BOX_AND )
                        iRes = Gia_ManHashAnd( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_NAND )
                        iRes = Abc_LitNot( Gia_ManHashAnd( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_OR )
                        iRes = Gia_ManHashOr( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_NOR )
                        iRes = Abc_LitNot( Gia_ManHashOr( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_XOR )
                        iRes = Gia_ManHashXor( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_XNOR )
                        iRes = Abc_LitNot( Gia_ManHashXor( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_SHARP )
                        iRes = Gia_ManHashAnd( pNew, pLits[0], Abc_LitNot(pLits[1]) );
                    else if ( Type == BAC_BOX_SHARPL )
                        iRes = Gia_ManHashAnd( pNew, Abc_LitNot(pLits[0]), pLits[1] );
                    else assert( 0 );
                }
                else if ( nLits == 3 )
                {
                    if ( Type == BAC_BOX_MUX )
                        iRes = Gia_ManHashMux( pNew, pLits[0], pLits[1], pLits[2] );
                    else if ( Type == BAC_BOX_MAJ )
                        iRes = Gia_ManHashMaj( pNew, pLits[0], pLits[1], pLits[2] );
                    else if ( Type == BAC_BOX_ADD )
                    {
                        int iRes0 = Gia_ManHashAnd( pNew, pLits[1], pLits[2] );
                        int iRes1 = Gia_ManHashOr( pNew, pLits[1], pLits[2] );
                        assert( Bac_BoxBoNum(p, iBox) == 2 );
                        if ( Bac_BoxBo(p, iBox, 0) == i ) // sum
                            iRes = Gia_ManHashXor( pNew, pLits[0], Gia_ManHashAnd(pNew, Abc_LitNot(iRes0), iRes1) );
                        else if ( Bac_BoxBo(p, iBox, 1) == i ) // cout
                            iRes = Gia_ManHashOr( pNew, iRes0, Gia_ManHashAnd(pNew, pLits[0], iRes1) );
                        else assert( 0 );
                    }
                    else assert( 0 );
                }
                else assert( 0 );
            }
        }
    }
    else assert( 0 );
    Bac_ObjSetCopy( p, i, iRes );
    return iRes;
}